

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iothubtransport_amqp_telemetry_messenger.c
# Opt level: O0

int telemetry_messenger_send_message_disposition
              (TELEMETRY_MESSENGER_HANDLE messenger_handle,
              TELEMETRY_MESSENGER_MESSAGE_DISPOSITION_INFO *disposition_info,
              TELEMETRY_MESSENGER_DISPOSITION_RESULT disposition_result)

{
  int iVar1;
  LOGGER_LOG p_Var2;
  AMQP_VALUE delivery_state;
  undefined8 in_stack_ffffffffffffff98;
  undefined4 uVar3;
  LOGGER_LOG l_4;
  LOGGER_LOG l_3;
  AMQP_VALUE uamqp_disposition_result;
  LOGGER_LOG l_2;
  TELEMETRY_MESSENGER_INSTANCE_conflict *messenger;
  LOGGER_LOG l_1;
  LOGGER_LOG l;
  int result;
  TELEMETRY_MESSENGER_DISPOSITION_RESULT disposition_result_local;
  TELEMETRY_MESSENGER_MESSAGE_DISPOSITION_INFO *disposition_info_local;
  TELEMETRY_MESSENGER_HANDLE messenger_handle_local;
  
  uVar3 = (undefined4)((ulong)in_stack_ffffffffffffff98 >> 0x20);
  if ((messenger_handle == (TELEMETRY_MESSENGER_HANDLE)0x0) ||
     (disposition_info == (TELEMETRY_MESSENGER_MESSAGE_DISPOSITION_INFO *)0x0)) {
    p_Var2 = xlogging_get_log_function();
    if (p_Var2 != (LOGGER_LOG)0x0) {
      (*p_Var2)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_amqp_telemetry_messenger.c"
                ,"telemetry_messenger_send_message_disposition",0x5cb,1,
                "Failed sending message disposition (either messenger_handle (%p) or disposition_info (%p) are NULL)"
                ,messenger_handle,disposition_info);
    }
    l._0_4_ = 0x5cc;
  }
  else if (disposition_info->source == (char *)0x0) {
    p_Var2 = xlogging_get_log_function();
    if (p_Var2 != (LOGGER_LOG)0x0) {
      (*p_Var2)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_amqp_telemetry_messenger.c"
                ,"telemetry_messenger_send_message_disposition",0x5d0,1,
                "Failed sending message disposition (disposition_info->source is NULL)");
    }
    l._0_4_ = 0x5d1;
  }
  else if (messenger_handle->message_receiver == (MESSAGE_RECEIVER_HANDLE)0x0) {
    p_Var2 = xlogging_get_log_function();
    if (p_Var2 != (LOGGER_LOG)0x0) {
      (*p_Var2)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_amqp_telemetry_messenger.c"
                ,"telemetry_messenger_send_message_disposition",0x5d9,1,
                "Failed sending message disposition (message_receiver is not created; check if it is subscribed)"
               );
    }
    l._0_4_ = 0x5da;
  }
  else {
    delivery_state = create_uamqp_disposition_result_from(disposition_result);
    if (delivery_state == (AMQP_VALUE)0x0) {
      p_Var2 = xlogging_get_log_function();
      if (p_Var2 != (LOGGER_LOG)0x0) {
        (*p_Var2)(AZ_LOG_ERROR,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_amqp_telemetry_messenger.c"
                  ,"telemetry_messenger_send_message_disposition",0x5e2,1,
                  "Failed sending message disposition (disposition result %d is not supported)",
                  CONCAT44(uVar3,disposition_result));
      }
      l._0_4_ = 0x5e3;
    }
    else {
      iVar1 = messagereceiver_send_message_disposition
                        (messenger_handle->message_receiver,disposition_info->source,
                         disposition_info->message_id,delivery_state);
      if (iVar1 == 0) {
        l._0_4_ = 0;
      }
      else {
        p_Var2 = xlogging_get_log_function();
        if (p_Var2 != (LOGGER_LOG)0x0) {
          (*p_Var2)(AZ_LOG_ERROR,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_amqp_telemetry_messenger.c"
                    ,"telemetry_messenger_send_message_disposition",0x5e9,1,
                    "Failed sending message disposition (messagereceiver_send_message_disposition failed)"
                   );
        }
        l._0_4_ = 0x5ea;
      }
      amqpvalue_destroy(delivery_state);
    }
  }
  return (int)l;
}

Assistant:

int telemetry_messenger_send_message_disposition(TELEMETRY_MESSENGER_HANDLE messenger_handle, TELEMETRY_MESSENGER_MESSAGE_DISPOSITION_INFO* disposition_info, TELEMETRY_MESSENGER_DISPOSITION_RESULT disposition_result)
{
    int result;

    if (messenger_handle == NULL || disposition_info == NULL)
    {
        LogError("Failed sending message disposition (either messenger_handle (%p) or disposition_info (%p) are NULL)", messenger_handle, disposition_info);
        result = MU_FAILURE;
    }
    else if (disposition_info->source == NULL)
    {
        LogError("Failed sending message disposition (disposition_info->source is NULL)");
        result = MU_FAILURE;
    }
    else
    {
        TELEMETRY_MESSENGER_INSTANCE* messenger = (TELEMETRY_MESSENGER_INSTANCE*)messenger_handle;

        if (messenger->message_receiver == NULL)
        {
            LogError("Failed sending message disposition (message_receiver is not created; check if it is subscribed)");
            result = MU_FAILURE;
        }
        else
        {
            AMQP_VALUE uamqp_disposition_result;

            if ((uamqp_disposition_result = create_uamqp_disposition_result_from(disposition_result)) == NULL)
            {
                LogError("Failed sending message disposition (disposition result %d is not supported)", disposition_result);
                result = MU_FAILURE;
            }
            else
            {
                if (messagereceiver_send_message_disposition(messenger->message_receiver, disposition_info->source, disposition_info->message_id, uamqp_disposition_result) != RESULT_OK)
                {
                    LogError("Failed sending message disposition (messagereceiver_send_message_disposition failed)");
                    result = MU_FAILURE;
                }
                else
                {
                    result = RESULT_OK;
                }

                amqpvalue_destroy(uamqp_disposition_result);
            }
        }
    }

    return result;
}